

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O3

void __thiscall
t_lua_generator::generate_deserialize_struct
          (t_lua_generator *this,ostream *out,t_struct *tstruct,bool local,string *prefix)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  long lVar3;
  char *pcVar4;
  string local_48;
  
  poVar2 = t_generator::indent((t_generator *)this,out);
  pcVar4 = "";
  lVar3 = 0;
  if ((int)CONCAT71(in_register_00000009,local) != 0) {
    pcVar4 = "local ";
    lVar3 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)CONCAT44(extraout_var,iVar1),
                      ((undefined8 *)CONCAT44(extraout_var,iVar1))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":new{}",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_48._M_dataplus._M_p,local_48._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":read(iprot)",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_lua_generator::generate_deserialize_struct(ostream& out,
                                                  t_struct* tstruct,
                                                  bool local,
                                                  string prefix) {
  indent(out) << (local ? "local " : "") << prefix << " = " << tstruct->get_name() << ":new{}"
              << endl << indent() << prefix << ":read(iprot)" << endl;
}